

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<float,3,4,0,3,4>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>const,3,4,false>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,_3,_4,_0,_3,_4> *dst,
               Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false> *src,
               assign_op<float,_float> *func)

{
  undefined8 func_00;
  Matrix<float,_3,_4,_0,_3,_4> *dstExpr;
  undefined1 local_68 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_30 [8];
  SrcEvaluatorType srcEvaluator;
  assign_op<float,_float> *func_local;
  Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false> *src_local;
  Matrix<float,_3,_4,_0,_3,_4> *dst_local;
  
  srcEvaluator.super_block_evaluator<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_Eigen::Matrix<float,_3,_4,_0,_3,_4>_>
  ._8_8_ = func;
  evaluator<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>_>::evaluator
            ((evaluator<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>_> *)
             local_30,src);
  resize_if_allowed<Eigen::Matrix<float,3,4,0,3,4>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>const,3,4,false>,float,float>
            (dst,src,(assign_op<float,_float> *)
                     srcEvaluator.
                     super_block_evaluator<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false,_true>
                     .
                     super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_Eigen::Matrix<float,_3,_4,_0,_3,_4>_>
                     ._8_8_);
  evaluator<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>::evaluator
            ((evaluator<Eigen::Matrix<float,_3,_4,_0,_3,_4>_> *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_block_evaluator<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false,_true>.
            super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_Eigen::Matrix<float,_3,_4,_0,_3,_4>_>
            ._8_8_;
  dstExpr = EigenBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>::const_cast_derived
                      ((EigenBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_> *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
              *)local_68,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_30,
             (assign_op<float,_float> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_2>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_68);
  evaluator<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>::~evaluator
            ((evaluator<Eigen::Matrix<float,_3,_4,_0,_3,_4>_> *)&kernel.m_dstExpr);
  evaluator<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>_>::~evaluator
            ((evaluator<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>_> *)
             local_30);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}